

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void dlib::serialize<std::allocator<char>>(vector<char,_std::allocator<char>_> *item,ostream *out)

{
  ostream *out_00;
  size_type sVar1;
  const_reference pvVar2;
  unsigned_long *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  serialization_error *e;
  unsigned_long size;
  
  out_00 = (ostream *)std::vector<char,_std::allocator<char>_>::size(in_RDI);
  serialize(in_RSI,out_00);
  sVar1 = std::vector<char,_std::allocator<char>_>::size(in_RDI);
  if (sVar1 != 0) {
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](in_RDI,0);
    std::vector<char,_std::allocator<char>_>::size(in_RDI);
    std::ostream::write((char *)in_RSI,(long)pvVar2);
  }
  return;
}

Assistant:

void serialize (
        const std::vector<char,alloc>& item,
        std::ostream& out
    )
    {
        try
        { 
            const unsigned long size = static_cast<unsigned long>(item.size());
            serialize(size,out); 
            if (item.size() != 0)
                out.write(&item[0], item.size());
        }
        catch (serialization_error& e)
        { throw serialization_error(e.info + "\n   while serializing object of type std::vector"); }
    }